

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

double __thiscall
duckdb::Interpolator<true>::Operation<double,double,duckdb::QuantileDirect<double>>
          (Interpolator<true> *this,double *v_t,Vector *result,QuantileDirect<double> *accessor)

{
  RESULT_TYPE_conflict4 input;
  double dVar1;
  
  input = InterpolateInternal<double,duckdb::QuantileDirect<double>>(this,v_t,accessor);
  dVar1 = Cast::Operation<double,double>(input);
  return dVar1;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(InterpolateInternal(v_t, accessor), result);
	}